

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

ostream * IO::operator<<(ostream *output,Reaction *reaction)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  reference pdVar4;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_a0;
  double *local_98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  double *local_88;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_80;
  double *local_78;
  int local_6c;
  _Self local_68;
  _Base_ptr local_60;
  int local_54;
  _Self local_50;
  _Base_ptr local_48;
  int local_3c;
  _Self local_38;
  _Base_ptr local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  const_iterator iterVec;
  const_iterator iter;
  Reaction *reaction_local;
  ostream *output_local;
  
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
              *)&iterVec);
  __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_28);
  poVar2 = std::operator<<(output,"    Reaction Data\n");
  poVar2 = std::operator<<(poVar2,"    (\n");
  poVar2 = std::operator<<(poVar2,"        Reversible  : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(reaction->flagReversible_ & 1));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        P Dependent : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(reaction->flagPressureDependent_ & 1));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        Duplicate : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(reaction->flagDuplicate_ & 1));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        Reactants\n");
  std::operator<<(poVar2,"        (\n");
  local_30 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin(&reaction->reactants_);
  iterVec._M_current = (double *)local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(&reaction->reactants_);
    bVar1 = std::operator!=((_Self *)&iterVec,&local_38);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            Name : ");
    local_3c = (int)std::setw(10);
    poVar2 = std::operator<<(poVar2,(_Setw)local_3c);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2," | Stoich : ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)&iterVec);
  }
  poVar2 = std::operator<<(output,"        )\n");
  poVar2 = std::operator<<(poVar2,"        Products\n");
  std::operator<<(poVar2,"        (\n");
  local_48 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin(&reaction->products_);
  iterVec._M_current = (double *)local_48;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(&reaction->products_);
    bVar1 = std::operator!=((_Self *)&iterVec,&local_50);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            Name : ");
    local_54 = (int)std::setw(10);
    poVar2 = std::operator<<(poVar2,(_Setw)local_54);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2," | Stoich : ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)&iterVec);
  }
  poVar2 = std::operator<<(output,"        )\n");
  poVar2 = std::operator<<(poVar2,"        Arrhenius\n");
  poVar2 = std::operator<<(poVar2,"        (\n");
  poVar2 = std::operator<<(poVar2,"            Forward A = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->forwardArrhenius_).A);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"                    n = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->forwardArrhenius_).n);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"                    E = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->forwardArrhenius_).E);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"            Reverse A = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->reverseArrhenius_).A);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"                    n = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->reverseArrhenius_).n);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"                    E = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(reaction->reverseArrhenius_).E);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"        )\n");
  poVar2 = std::operator<<(poVar2,"        Third Bodies\n");
  poVar2 = std::operator<<(poVar2,"        (\n");
  poVar2 = std::operator<<(poVar2,"            Third Body : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(reaction->flagThirdBody_ & 1));
  std::operator<<(poVar2,"\n");
  local_60 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::begin(&reaction->thirdBodies_);
  iterVec._M_current = (double *)local_60;
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         ::end(&reaction->thirdBodies_);
    bVar1 = std::operator!=((_Self *)&iterVec,&local_68);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            Name : ");
    local_6c = (int)std::setw(10);
    poVar2 = std::operator<<(poVar2,(_Setw)local_6c);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2," | Efficiency Factor : ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                           *)&iterVec);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    std::operator<<(poVar2,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                  *)&iterVec);
  }
  local_78 = (double *)std::vector<double,_std::allocator<double>_>::begin(&reaction->LOW_);
  local_28._M_current = local_78;
  while( true ) {
    local_80._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::end(&reaction->LOW_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_80);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            LOW : ");
    pdVar4 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  local_88 = (double *)std::vector<double,_std::allocator<double>_>::begin(&reaction->TROE_);
  local_28._M_current = local_88;
  while( true ) {
    local_90._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::end(&reaction->TROE_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_90);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            TROE : ");
    pdVar4 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  local_98 = (double *)std::vector<double,_std::allocator<double>_>::begin(&reaction->SRI_);
  local_28._M_current = local_98;
  while( true ) {
    local_a0._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::end(&reaction->SRI_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_a0);
    if (!bVar1) break;
    poVar2 = std::operator<<(output,"            SRI : ");
    pdVar4 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  poVar2 = std::operator<<(output,"        )\n");
  std::operator<<(poVar2,"    )");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Reaction& reaction)
    {
        multimap<string,double>::const_iterator iter;
        vector<double>::const_iterator iterVec;

        output << "    Reaction Data\n"
               << "    (\n"
               << "        Reversible  : " << reaction.flagReversible_ << "\n"
               << "        P Dependent : " << reaction.flagPressureDependent_ << "\n"
               << "        Duplicate : " << reaction.flagDuplicate_ << "\n"
               << "        Reactants\n"
               << "        (\n";
       for (iter = reaction.reactants_.begin(); iter != reaction.reactants_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Products\n"
               << "        (\n";
       for (iter = reaction.products_.begin(); iter != reaction.products_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Stoich : " << iter->second << "\n";
       }
        output << "        )\n"
               << "        Arrhenius\n"
               << "        (\n"
               << "            Forward A = " << reaction.forwardArrhenius_.A << "\n"
               << "                    n = " << reaction.forwardArrhenius_.n << "\n"
               << "                    E = " << reaction.forwardArrhenius_.E << "\n"
               << "            Reverse A = " << reaction.reverseArrhenius_.A << "\n"
               << "                    n = " << reaction.reverseArrhenius_.n << "\n"
               << "                    E = " << reaction.reverseArrhenius_.E << "\n"
               << "        )\n"
               << "        Third Bodies\n"
               << "        (\n"
               << "            Third Body : " << reaction.flagThirdBody_ << "\n";
       for (iter = reaction.thirdBodies_.begin(); iter != reaction.thirdBodies_.end(); ++iter)
       {
        output << "            Name : " << setw(10) <<iter->first << " | Efficiency Factor : " << iter->second << "\n";
       }
       for (iterVec = reaction.LOW_.begin(); iterVec != reaction.LOW_.end(); ++iterVec)
       {
        output << "            LOW : " << *iterVec << "\n";
       }
       for (iterVec = reaction.TROE_.begin(); iterVec != reaction.TROE_.end(); ++iterVec)
       {
        output << "            TROE : " << *iterVec << "\n";
       }
       for (iterVec = reaction.SRI_.begin(); iterVec != reaction.SRI_.end(); ++iterVec)
       {
        output << "            SRI : " << *iterVec << "\n";
       }
        output << "        )\n"
               << "    )";
        return output;
    }